

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * unescapeHtml(QString *__return_storage_ptr__,QString *escaped)

{
  Data *pDVar1;
  QLatin1String QVar2;
  QLatin1String QVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  
  pDVar1 = (escaped->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (escaped->d).ptr;
  (__return_storage_ptr__->d).size = (escaped->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar2.m_data = (char *)0x4;
  QVar2.m_size = (qsizetype)__return_storage_ptr__;
  QVar6.m_data = (char *)0x1;
  QVar6.m_size = (qsizetype)"&lt;";
  QString::replace(QVar2,QVar6,0x11b79f);
  QVar3.m_data = (char *)0x4;
  QVar3.m_size = (qsizetype)__return_storage_ptr__;
  QVar7.m_data = (char *)0x1;
  QVar7.m_size = (qsizetype)"&gt;";
  QString::replace(QVar3,QVar7,0x11a626);
  QVar4.m_data = (char *)0x6;
  QVar4.m_size = (qsizetype)__return_storage_ptr__;
  QVar8.m_data = (char *)0x1;
  QVar8.m_size = (qsizetype)"&quot;";
  QString::replace(QVar4,QVar8,0x11b7a1);
  QVar5.m_data = (char *)0x5;
  QVar5.m_size = (qsizetype)__return_storage_ptr__;
  QVar9.m_data = (char *)0x1;
  QVar9.m_size = (qsizetype)"&amp;";
  QString::replace(QVar5,QVar9,0x11b7a3);
  return __return_storage_ptr__;
}

Assistant:

QString unescapeHtml(const QString& escaped)
{
	QString unescaped(escaped);
	unescaped.replace(QLatin1String("&lt;"), QLatin1String("<"));
	unescaped.replace(QLatin1String("&gt;"), QLatin1String(">"));
	unescaped.replace(QLatin1String("&quot;"), QLatin1String("\""));
	unescaped.replace(QLatin1String("&amp;"), QLatin1String("&"));
	return unescaped;
}